

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O2

void __thiscall RTQuaternion::toAngleVector(RTQuaternion *this,RTFLOAT *angle,RTVector3 *vec)

{
  float __x;
  float fVar1;
  RTFLOAT RVar2;
  
  __x = acosf(this->m_data[0]);
  fVar1 = sinf(__x);
  RVar2 = 0.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    vec->m_data[0] = this->m_data[1] / fVar1;
    vec->m_data[1] = this->m_data[1] / fVar1;
    RVar2 = this->m_data[1] / fVar1;
  }
  else {
    vec->m_data[0] = 1.0;
    vec->m_data[1] = 0.0;
  }
  vec->m_data[2] = RVar2;
  *angle = __x + __x;
  return;
}

Assistant:

void RTQuaternion::toAngleVector(RTFLOAT& angle, RTVector3& vec)
{
    RTFLOAT halfTheta;
    RTFLOAT sinHalfTheta;

    halfTheta = acos(m_data[0]);
    sinHalfTheta = sin(halfTheta);

    if (sinHalfTheta == 0) {
        vec.setX(1.0);
        vec.setY(0);
        vec.setZ(0);
    } else {
        vec.setX(m_data[1] / sinHalfTheta);
        vec.setY(m_data[1] / sinHalfTheta);
        vec.setZ(m_data[1] / sinHalfTheta);
    }
    angle = 2.0 * halfTheta;
}